

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

string * __thiscall
flatbuffers::python::PythonGenerator::NestedFlatbufferType
          (string *__return_storage_ptr__,PythonGenerator *this,string *unqualified_name)

{
  string local_50;
  undefined1 local_29;
  StructDef *local_28;
  StructDef *nested_root;
  string *unqualified_name_local;
  PythonGenerator *this_local;
  string *qualified_name;
  
  nested_root = (StructDef *)unqualified_name;
  unqualified_name_local = (string *)this;
  this_local = (PythonGenerator *)__return_storage_ptr__;
  local_28 = Parser::LookupStruct((this->super_BaseGenerator).parser_,unqualified_name);
  local_29 = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (local_28 == (StructDef *)0x0) {
    Namer::NamespacedType
              (&local_50,&(this->namer_).super_Namer,
               &((this->super_BaseGenerator).parser_)->current_namespace_->components,
               unqualified_name);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    local_28 = Parser::LookupStruct((this->super_BaseGenerator).parser_,__return_storage_ptr__);
  }
  if (local_28 == (StructDef *)0x0) {
    __assert_fail("nested_root",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_python.cpp"
                  ,0x450,
                  "std::string flatbuffers::python::PythonGenerator::NestedFlatbufferType(std::string) const"
                 );
  }
  return __return_storage_ptr__;
}

Assistant:

std::string NestedFlatbufferType(std::string unqualified_name) const {
    StructDef *nested_root = parser_.LookupStruct(unqualified_name);
    std::string qualified_name;
    if (nested_root == nullptr) {
      qualified_name = namer_.NamespacedType(
          parser_.current_namespace_->components, unqualified_name);
      // Double check qualified name just to be sure it exists.
      nested_root = parser_.LookupStruct(qualified_name);
    }
    FLATBUFFERS_ASSERT(nested_root);  // Guaranteed to exist by parser.
    return qualified_name;
  }